

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O0

void __thiscall
miner_tests::MinerTestingSetup::TestBasicMining
          (MinerTestingSetup *this,CScript *scriptPubKey,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txFirst,int baseheight)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  bool bVar6;
  undefined1 uVar7;
  int iVar8;
  Txid *pTVar9;
  reference pvVar10;
  reference pvVar11;
  CBlockIndex *pCVar12;
  undefined8 *puVar13;
  void *pvVar14;
  reference pvVar15;
  int64_t iVar16;
  int64_t iVar17;
  CBlockIndex **ppCVar18;
  lazy_ostream *scriptPubKeyIn;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffb498;
  TestMemPoolEntryHelper *in_stack_ffffffffffffb4a0;
  NodeSeconds in_stack_ffffffffffffb4a8;
  CBlockIndex *in_stack_ffffffffffffb4b0;
  undefined4 in_stack_ffffffffffffb4b8;
  int in_stack_ffffffffffffb4bc;
  undefined4 in_stack_ffffffffffffb4c0;
  int in_stack_ffffffffffffb4c4;
  CTransaction *in_stack_ffffffffffffb4c8;
  CTxMemPoolEntry *in_stack_ffffffffffffb4d0;
  const_string *file;
  undefined7 in_stack_ffffffffffffb4d8;
  undefined1 in_stack_ffffffffffffb4df;
  iterator in_stack_ffffffffffffb4e0;
  iterator in_stack_ffffffffffffb4e8;
  MinerTestingSetup *in_stack_ffffffffffffb4f0;
  CScript *in_stack_ffffffffffffb6a8;
  undefined7 in_stack_ffffffffffffb6b0;
  undefined1 in_stack_ffffffffffffb6b7;
  CBlockIndex *ancestor_1;
  int i_6;
  CBlockIndex *ancestor;
  int i_5;
  CBlockIndex *active_chain_tip_1;
  int i_4;
  int SEQUENCE_LOCK_TIME;
  CBlockIndex *active_chain_tip;
  int flags;
  CTxMemPool *tx_mempool;
  CBlockIndex *del;
  runtime_error *ex_4;
  CBlockIndex *next_1;
  CBlockIndex *prev_1;
  CBlockIndex *next;
  CBlockIndex *prev;
  int nHeight;
  CTxMemPool *tx_mempool_8;
  runtime_error *ex_3;
  CTxMemPool *tx_mempool_7;
  runtime_error *ex_2;
  CTxMemPool *tx_mempool_6;
  CTxMemPool *tx_mempool_5;
  runtime_error *ex_1;
  CTxMemPool *tx_mempool_4;
  bool spendsCoinbase_2;
  uint i_3;
  uint i_2;
  CTxMemPool *tx_mempool_3;
  bool spendsCoinbase_1;
  uint i_1;
  CTxMemPool *tx_mempool_2;
  runtime_error *ex;
  bool spendsCoinbase;
  uint i;
  CTxMemPool *tx_mempool_1;
  CAmount HIGHERFEE;
  CAmount HIGHFEE;
  CAmount LOWFEE;
  CAmount BLOCKSUBSIDY;
  int baseheight_local;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *txFirst_local;
  CScript *scriptPubKey_local;
  MinerTestingSetup *this_local;
  TestMemPoolEntryHelper local_3c0c;
  const_string local_3bb0 [2];
  lazy_ostream local_3b90 [2];
  assertion_result local_3b68 [2];
  CBlockIndex *local_3b30;
  TestMemPoolEntryHelper local_3b24;
  const_string local_3ac8 [2];
  lazy_ostream local_3aa8 [2];
  assertion_result local_3a88 [2];
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate;
  const_string local_3a48 [2];
  lazy_ostream local_3a28 [2];
  assertion_result local_3a08 [2];
  const_string local_39d0 [2];
  lazy_ostream local_39b0 [2];
  assertion_result local_3990 [2];
  const_string local_3958 [2];
  lazy_ostream local_3938 [2];
  assertion_result local_3918 [2];
  const_string local_38e0 [2];
  lazy_ostream local_38c0 [2];
  assertion_result local_38a0 [2];
  const_string local_3868 [2];
  lazy_ostream local_3848 [2];
  CBlockIndex *local_3828;
  assertion_result local_3820 [2];
  const_string local_37e8 [2];
  lazy_ostream local_37c8 [2];
  assertion_result local_37a8 [2];
  const_string local_3770 [2];
  lazy_ostream local_3750 [2];
  assertion_result local_3730 [2];
  const_string local_36f8 [2];
  lazy_ostream local_36d8 [2];
  CBlockIndex *local_36b8;
  assertion_result local_36b0 [2];
  const_string local_3678 [2];
  lazy_ostream local_3658 [2];
  assertion_result local_3638 [2];
  const_string local_3600 [2];
  lazy_ostream local_35e0 [2];
  assertion_result local_35c0 [2];
  const_string local_3588 [2];
  lazy_ostream local_3568 [2];
  CBlockIndex *local_3548;
  assertion_result local_3540 [2];
  CBlockIndex *local_3508;
  const_string local_3500 [2];
  lazy_ostream local_34e0 [2];
  assertion_result local_34b8 [2];
  const_string local_3480 [2];
  lazy_ostream local_3460 [2];
  assertion_result local_3440 [2];
  const_string local_3408 [2];
  lazy_ostream local_33e8 [2];
  CBlockIndex *local_33c8;
  assertion_result local_33c0 [2];
  const_string local_3388 [2];
  lazy_ostream local_3368 [2];
  assertion_result local_3340 [2];
  const_string local_3308 [2];
  lazy_ostream local_32e8 [2];
  assertion_result local_32c8 [2];
  const_string local_3290 [2];
  lazy_ostream local_3270 [2];
  CBlockIndex *local_3250;
  assertion_result local_3248 [2];
  vector<int,_std::allocator<int>_> prevheights;
  const_string local_3188;
  lazy_ostream local_3178 [2];
  assertion_result local_3158 [6];
  const_string local_30c8 [2];
  lazy_ostream local_30a8 [2];
  assertion_result local_3080 [2];
  const_string local_3048 [2];
  lazy_ostream local_3028 [2];
  assertion_result local_3000 [7];
  const_string local_2f58;
  lazy_ostream local_2f48 [2];
  assertion_result local_2f28 [8];
  const_string local_2e58;
  lazy_ostream local_2e48 [2];
  assertion_result local_2e28 [4];
  const_string local_2dc8 [2];
  lazy_ostream local_2da8 [2];
  assertion_result local_2d80 [7];
  const_string local_2cd8;
  lazy_ostream local_2cc8 [2];
  assertion_result local_2ca8 [4];
  const_string local_2c48 [2];
  lazy_ostream local_2c28 [2];
  assertion_result local_2c00 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchData;
  const_string local_2b98 [2];
  lazy_ostream local_2b78 [2];
  assertion_result local_2b50 [7];
  const_string local_2aa8;
  lazy_ostream local_2a98 [2];
  assertion_result local_2a78 [4];
  const_string local_2a18 [2];
  lazy_ostream local_29f8 [2];
  assertion_result local_29d8 [2];
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate_1;
  TestMemPoolEntryHelper entry;
  CMutableTransaction tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_e1c;
  undefined8 uStack_e14;
  undefined8 local_e0c;
  undefined8 uStack_e04;
  CScript script;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Txid hash;
  
  local_3000[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_3000[0]._1_7_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  transaction_identifier<false>::transaction_identifier
            ((transaction_identifier<false> *)in_stack_ffffffffffffb498);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffb498);
  TestMemPoolEntryHelper::TestMemPoolEntryHelper
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  AssemblerForTest((MinerTestingSetup *)
                   CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                   (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  ::node::BlockAssembler::CreateNewBlock
            ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
             in_stack_ffffffffffffb6a8);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_29d8,local_29f8,local_2a18,0xea,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
             (size_type)in_stack_ffffffffffffb4b0);
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  (pvVar10->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
             (size_type)in_stack_ffffffffffffb4b0);
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = 5000000000;
  for (i = 0; i < 0x3e9; i = i + 1) {
    pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                         in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
    pvVar11->nValue = pvVar11->nValue + -1000000;
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8))
    ;
    TestMemPoolEntryHelper::Fee
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
               (CAmount)in_stack_ffffffffffffb4a0);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
    TestMemPoolEntryHelper::SpendsCoinbase
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    TestMemPoolEntryHelper::FromTx
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
               (CMutableTransaction *)in_stack_ffffffffffffb4c8);
    CTxMemPool::addUnchecked
              ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               in_stack_ffffffffffffb4d0);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
    pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                         (size_type)in_stack_ffffffffffffb4a0);
    *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_68;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         uStack_60;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
         = local_58;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
         = uStack_50;
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
                 (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
                 SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffb4a0,(char (*) [53])in_stack_ffffffffffffb498)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      in_stack_ffffffffffffb498 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2a78,local_2a98,&local_2aa8,0xfd,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffb498);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffb498);
      bVar6 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar6);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             in_stack_ffffffffffffb4a8.__d.__r);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = 5000000000;
  for (i_1 = 0; i_1 < 0x3e9; i_1 = i_1 + 1) {
    pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                         in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
    pvVar11->nValue = pvVar11->nValue + -1000000;
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8))
    ;
    TestMemPoolEntryHelper::Fee
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
               (CAmount)in_stack_ffffffffffffb4a0);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
    TestMemPoolEntryHelper::SpendsCoinbase
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    TestMemPoolEntryHelper::SigOpsCost
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
               (uint)((ulong)in_stack_ffffffffffffb4a0 >> 0x20));
    TestMemPoolEntryHelper::FromTx
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
               (CMutableTransaction *)in_stack_ffffffffffffb4c8);
    CTxMemPool::addUnchecked
              ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               in_stack_ffffffffffffb4d0);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
    pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                         (size_type)in_stack_ffffffffffffb4a0);
    *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_1d8;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         uStack_1d0;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
         = local_1c8;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
         = uStack_1c0;
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b50,local_2b78,local_2b98,0x10e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffb498);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffb4c8,
             CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffb498);
  for (i_2 = 0; i_2 < 0x12; i_2 = i_2 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
               (size_type)in_stack_ffffffffffffb4a0);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              ((span<const_unsigned_char,_18446744073709551615UL> *)
               in_stack_ffffffffffffb4a8.__d.__r,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffb4a0);
    b._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffb4d8;
    b._M_ptr = (pointer)in_stack_ffffffffffffb4d0;
    b._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffb4df;
    CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),b);
    CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                        (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = 5000000000;
  for (i_3 = 0; i_3 < 0x80; i_3 = i_3 + 1) {
    pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                         in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
    pvVar11->nValue = pvVar11->nValue + -1000000;
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8))
    ;
    TestMemPoolEntryHelper::Fee
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
               (CAmount)in_stack_ffffffffffffb4a0);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
    TestMemPoolEntryHelper::SpendsCoinbase
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    TestMemPoolEntryHelper::FromTx
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
               (CMutableTransaction *)in_stack_ffffffffffffb4c8);
    CTxMemPool::addUnchecked
              ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               in_stack_ffffffffffffb4d0);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
    pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                         (size_type)in_stack_ffffffffffffb4a0);
    *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_328;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         uStack_320;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
         = local_318;
    *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
         = uStack_310;
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2c00,local_2c28,local_2c48,0x126,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffb4a8.__d.__r);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
                 (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
                 SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffb4a0,(char (*) [53])in_stack_ffffffffffffb498)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      in_stack_ffffffffffffb498 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2ca8,local_2cc8,&local_2cd8,0x130,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffb498);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffb498);
      bVar6 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar6);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = (CAmount)&DAT_124101100;
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::SpendsCoinbase
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_5d8;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_5d0;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_5e8
  ;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_5e0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
             (size_type)in_stack_ffffffffffffb4b0);
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  (pvVar10->prevout).n = 0;
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  lVar2 = pvVar11->nValue;
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = lVar2 + 4600000000;
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::SpendsCoinbase
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2d80,local_2da8,local_2dc8,0x145,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
             (size_type)in_stack_ffffffffffffb4b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  COutPoint::SetNull((COutPoint *)in_stack_ffffffffffffb498);
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = 0;
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::SpendsCoinbase
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
                 (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
                 SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffb4a0,(char (*) [53])in_stack_ffffffffffffb498)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      in_stack_ffffffffffffb498 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2e28,local_2e48,&local_2e58,0x155,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffb498);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffb498);
      bVar6 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar6);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = (CAmount)&DAT_124101100;
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::SpendsCoinbase
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::SpendsCoinbase
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
                 (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
                 SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffb4a0,(char (*) [53])in_stack_ffffffffffffb498)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      in_stack_ffffffffffffb498 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2f28,local_2f48,&local_2f58,0x166,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffb498);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffb498);
      bVar6 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar6);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  iVar8 = CChain::Height((CChain *)in_stack_ffffffffffffb498);
  while( true ) {
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    if (0x3344e < pCVar12->nHeight) break;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    puVar13 = (undefined8 *)operator_new(0x98);
    puVar13[0x10] = 0;
    puVar13[0x11] = 0;
    puVar13[0xe] = 0;
    puVar13[0xf] = 0;
    puVar13[0xc] = 0;
    puVar13[0xd] = 0;
    puVar13[10] = 0;
    puVar13[0xb] = 0;
    puVar13[8] = 0;
    puVar13[9] = 0;
    puVar13[6] = 0;
    puVar13[7] = 0;
    puVar13[4] = 0;
    puVar13[5] = 0;
    puVar13[2] = 0;
    puVar13[3] = 0;
    *puVar13 = 0;
    puVar13[1] = 0;
    puVar13[0x12] = 0;
    CBlockIndex::CBlockIndex((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r);
    pvVar14 = operator_new(0x20);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffb4c8);
    *puVar13 = pvVar14;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffb4a8.__d.__r);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r);
    CCoinsViewCache::SetBestBlock((CCoinsViewCache *)in_stack_ffffffffffffb498,(uint256 *)0x73cdcc);
    puVar13[1] = pCVar12;
    *(int *)(puVar13 + 3) = pCVar12->nHeight + 1;
    CBlockIndex::BuildSkip((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::SetTip((CChain *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                   in_stack_ffffffffffffb4b0);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3000,local_3028,local_3048,0x17a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  while( true ) {
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    if (209999 < pCVar12->nHeight) break;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    puVar13 = (undefined8 *)operator_new(0x98);
    puVar13[0x10] = 0;
    puVar13[0x11] = 0;
    puVar13[0xe] = 0;
    puVar13[0xf] = 0;
    puVar13[0xc] = 0;
    puVar13[0xd] = 0;
    puVar13[10] = 0;
    puVar13[0xb] = 0;
    puVar13[8] = 0;
    puVar13[9] = 0;
    puVar13[6] = 0;
    puVar13[7] = 0;
    puVar13[4] = 0;
    puVar13[5] = 0;
    puVar13[2] = 0;
    puVar13[3] = 0;
    *puVar13 = 0;
    puVar13[1] = 0;
    puVar13[0x12] = 0;
    CBlockIndex::CBlockIndex((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r);
    pvVar14 = operator_new(0x20);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffb4c8);
    *puVar13 = pvVar14;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffb4a8.__d.__r);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r);
    CCoinsViewCache::SetBestBlock((CCoinsViewCache *)in_stack_ffffffffffffb498,(uint256 *)0x73d2e8);
    puVar13[1] = pCVar12;
    *(int *)(puVar13 + 3) = pCVar12->nHeight + 1;
    CBlockIndex::BuildSkip((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::SetTip((CChain *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                   in_stack_ffffffffffffb4b0);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3080,local_30a8,local_30c8,0x186,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  (pvVar10->prevout).n = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = 0x129f6afc0;
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  CScript::CScript((CScript *)in_stack_ffffffffffffb498,(CScript *)0x73d74d);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  ScriptHash::ScriptHash
            ((ScriptHash *)in_stack_ffffffffffffb4b0,(CScript *)in_stack_ffffffffffffb4a8.__d.__r);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffb4a8.__d.__r,(ScriptHash *)in_stack_ffffffffffffb4a0);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffb498);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffb498);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::SpendsCoinbase
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_e0c;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_e04;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_e1c
  ;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_e14;
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffb4a0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffb4a0);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffb498);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffb4c8,
             in_stack_ffffffffffffb4e8,in_stack_ffffffffffffb4e0,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffb4a8.__d.__r,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffb4a0);
  b_00._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffb4d8;
  b_00._M_ptr = (pointer)in_stack_ffffffffffffb4d0;
  b_00._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffb4df;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),b_00)
  ;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffb4a8.__d.__r);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffb498);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = pvVar11->nValue + -1000000;
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::SpendsCoinbase
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(in_stack_ffffffffffffb6b7,in_stack_ffffffffffffb6b0),
               in_stack_ffffffffffffb6a8);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
                 (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
                 SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffb4a0,(char (*) [53])in_stack_ffffffffffffb498)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
                 (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
      in_stack_ffffffffffffb498 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_3158,local_3178,&local_3188,0x197,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffb498);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffb498);
      bVar6 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar6);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  while( true ) {
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    if (pCVar12->nHeight <= iVar8) break;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    inline_assertion_check<true,CBlockIndex*&>
              ((CBlockIndex **)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (char *)in_stack_ffffffffffffb4d0,(int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
               (char *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CChain::SetTip((CChain *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                   in_stack_ffffffffffffb4b0);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffb4a8.__d.__r);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r);
    CCoinsViewCache::SetBestBlock((CCoinsViewCache *)in_stack_ffffffffffffb498,(uint256 *)0x73e37b);
    if (pCVar12->phashBlock != (uint256 *)0x0) {
      operator_delete(pCVar12->phashBlock,0x20);
    }
    if (pCVar12 != (CBlockIndex *)0x0) {
      operator_delete(pCVar12,0x98);
    }
  }
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  MakeMempool((MinerTestingSetup *)in_stack_ffffffffffffb4d0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb498);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb4d0,
             (char *)in_stack_ffffffffffffb4c8,
             (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
             in_stack_ffffffffffffb4bc,SUB41((uint)in_stack_ffffffffffffb4b8 >> 0x18,0));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  CBlockIndex::GetMedianTimePast
            ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  SetMockTime((int64_t)in_stack_ffffffffffffb498);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb498);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
             (size_type)in_stack_ffffffffffffb4b0);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
             (size_type)in_stack_ffffffffffffb4b0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  (pvVar10->prevout).n = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  iVar8 = pCVar12->nHeight;
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar10->nSequence = iVar8 + 1;
  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *pvVar15 = baseheight + 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
             (size_type)in_stack_ffffffffffffb4b0);
  pvVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar11->nValue = (CAmount)&DAT_124101100;
  CScript::CScript((CScript *)in_stack_ffffffffffffb498);
  CScript::operator<<((CScript *)in_stack_ffffffffffffb4d0,
                      (opcodetype)((ulong)in_stack_ffffffffffffb4c8 >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffb4a8.__d.__r,
             (size_type)in_stack_ffffffffffffb4a0);
  CScript::operator=((CScript *)in_stack_ffffffffffffb4a8.__d.__r,
                     (CScript *)in_stack_ffffffffffffb4a0);
  CScript::~CScript((CScript *)in_stack_ffffffffffffb498);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             (CAmount)in_stack_ffffffffffffb4a0);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::SpendsCoinbase
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4a8.__d.__r,
             SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    local_3250 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    inline_assertion_check<true,CBlockIndex*>
              ((CBlockIndex **)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (char *)in_stack_ffffffffffffb4d0,(int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
               (char *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    CheckFinalTxAtTip((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                      (CTransaction *)in_stack_ffffffffffffb4b0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3248,local_3270,local_3290,0x1bb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    TestSequenceLocks(in_stack_ffffffffffffb4f0,(CTransaction *)in_stack_ffffffffffffb4e8.ptr,
                      (CTxMemPool *)in_stack_ffffffffffffb4e0.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_32c8,local_32e8,local_3308,0x1bc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    CreateBlockIndex(in_stack_ffffffffffffb4c4,
                     (CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    std::unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_>::operator*
              ((unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    SequenceLocks(in_stack_ffffffffffffb4c8,in_stack_ffffffffffffb4c4,
                  (vector<int,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                  in_stack_ffffffffffffb4b0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3340,local_3368,local_3388,0x1c0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    std::unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_>::~unique_ptr
              ((unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  iVar16 = CBlockIndex::GetMedianTimePast
                     ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  CChain::operator[]((CChain *)in_stack_ffffffffffffb4b0,
                     (int)((ulong)in_stack_ffffffffffffb4a8.__d.__r >> 0x20));
  iVar17 = CBlockIndex::GetMedianTimePast
                     ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar10->nSequence = (int)((ulong)((iVar16 + 1) - iVar17) >> 9) + 1U | 0x400000;
  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *pvVar15 = baseheight + 2;
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    local_33c8 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    inline_assertion_check<true,CBlockIndex*>
              ((CBlockIndex **)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (char *)in_stack_ffffffffffffb4d0,(int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
               (char *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    CheckFinalTxAtTip((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                      (CTransaction *)in_stack_ffffffffffffb4b0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_33c0,local_33e8,local_3408,0x1c9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    TestSequenceLocks(in_stack_ffffffffffffb4f0,(CTransaction *)in_stack_ffffffffffffb4e8.ptr,
                      (CTxMemPool *)in_stack_ffffffffffffb4e0.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3440,local_3460,local_3480,0x1ca,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  for (i_4 = 0; i_4 < 0xb; i_4 = i_4 + 1) {
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    pCVar12 = CBlockIndex::GetAncestor
                        ((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r,
                         (int)((ulong)in_stack_ffffffffffffb4a0 >> 0x20));
    pCVar12->nTime = pCVar12->nTime + 0x200;
  }
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    CreateBlockIndex(in_stack_ffffffffffffb4c4,
                     (CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    std::unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_>::operator*
              ((unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    SequenceLocks(in_stack_ffffffffffffb4c8,in_stack_ffffffffffffb4c4,
                  (vector<int,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                  in_stack_ffffffffffffb4b0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_34b8,local_34e0,local_3500,0x1d1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    std::unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_>::~unique_ptr
              ((unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  for (i_5 = 0; i_5 < 0xb; i_5 = i_5 + 1) {
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    local_3508 = CBlockIndex::GetAncestor
                           ((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r,
                            (int)((ulong)in_stack_ffffffffffffb4a0 >> 0x20));
    ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                         ((CBlockIndex **)
                          CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
                          (char *)in_stack_ffffffffffffb4d0,
                          (int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
                          (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                          (char *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    (*ppCVar18)->nTime = (*ppCVar18)->nTime - 0x200;
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar10->nSequence = 0xfffffffe;
  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *pvVar15 = baseheight + 3;
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    local_3548 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    inline_assertion_check<true,CBlockIndex*>
              ((CBlockIndex **)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (char *)in_stack_ffffffffffffb4d0,(int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
               (char *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    CheckFinalTxAtTip((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                      (CTransaction *)in_stack_ffffffffffffb4b0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3540,local_3568,local_3588,0x1e0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    TestSequenceLocks(in_stack_ffffffffffffb4f0,(CTransaction *)in_stack_ffffffffffffb4e8.ptr,
                      (CTxMemPool *)in_stack_ffffffffffffb4e0.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_35c0,local_35e0,local_3600,0x1e1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    CBlockIndex::GetMedianTimePast
              ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    IsFinalTx((CTransaction *)in_stack_ffffffffffffb4d0,
              (int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
              CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3638,local_3658,local_3678,0x1e2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb4a8.__d.__r,(size_type)in_stack_ffffffffffffb4a0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb498);
  pTVar9 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb498);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  uVar3 = *(undefined8 *)(pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar4;
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  CBlockIndex::GetMedianTimePast
            ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
             (size_type)in_stack_ffffffffffffb4b0);
  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *pvVar15 = baseheight + 4;
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::Time(in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb4a8);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb4d0,
             (CMutableTransaction *)in_stack_ffffffffffffb4c8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
             in_stack_ffffffffffffb4d0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    local_36b8 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    inline_assertion_check<true,CBlockIndex*>
              ((CBlockIndex **)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (char *)in_stack_ffffffffffffb4d0,(int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
               (char *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    CheckFinalTxAtTip((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                      (CTransaction *)in_stack_ffffffffffffb4b0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_36b0,local_36d8,local_36f8,0x1eb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    uVar7 = TestSequenceLocks(in_stack_ffffffffffffb4f0,
                              (CTransaction *)in_stack_ffffffffffffb4e8.ptr,
                              (CTxMemPool *)in_stack_ffffffffffffb4e0.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    scriptPubKeyIn = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3730,local_3750,local_3770,0x1ec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    CBlockIndex::GetMedianTimePast
              ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    IsFinalTx((CTransaction *)in_stack_ffffffffffffb4d0,
              (int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
              CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_37a8,local_37c8,local_37e8,0x1ed,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_1948;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_1940;
  *(undefined8 *)(pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       local_1958;
  *(undefined8 *)((pvVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_1950;
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  iVar8 = pCVar12->nHeight;
  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  *pvVar15 = iVar8 + 1;
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar10->nSequence = 0;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    local_3828 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    inline_assertion_check<true,CBlockIndex*>
              ((CBlockIndex **)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (char *)in_stack_ffffffffffffb4d0,(int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
               (char *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    CheckFinalTxAtTip((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8),
                      (CTransaction *)in_stack_ffffffffffffb4b0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3820,local_3848,local_3868,500,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    TestSequenceLocks(in_stack_ffffffffffffb4f0,(CTransaction *)in_stack_ffffffffffffb4e8.ptr,
                      (CTxMemPool *)in_stack_ffffffffffffb4e0.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_38a0,local_38c0,local_38e0,0x1f5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar10->nSequence = 1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    TestSequenceLocks(in_stack_ffffffffffffb4f0,(CTransaction *)in_stack_ffffffffffffb4e8.ptr,
                      (CTxMemPool *)in_stack_ffffffffffffb4e0.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3918,local_3938,local_3958,0x1f7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar10->nSequence = 0x400000;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    TestSequenceLocks(in_stack_ffffffffffffb4f0,(CTransaction *)in_stack_ffffffffffffb4e8.ptr,
                      (CTxMemPool *)in_stack_ffffffffffffb4e0.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3990,local_39b0,local_39d0,0x1f9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffb4a8.__d.__r,
                       (size_type)in_stack_ffffffffffffb4a0);
  pvVar10->nSequence = 0x400001;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (CMutableTransaction *)in_stack_ffffffffffffb4d0);
    TestSequenceLocks(in_stack_ffffffffffffb4f0,(CTransaction *)in_stack_ffffffffffffb4e8.ptr,
                      (CTxMemPool *)in_stack_ffffffffffffb4e0.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               SUB81((ulong)in_stack_ffffffffffffb4a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3a08,local_3a28,local_3a48,0x1fb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  AssemblerForTest((MinerTestingSetup *)
                   CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                   (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  ::node::BlockAssembler::CreateNewBlock
            ((BlockAssembler *)CONCAT17(uVar7,in_stack_ffffffffffffb6b0),(CScript *)scriptPubKeyIn);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3a88,local_3aa8,local_3ac8,0x1fe,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,(char (*) [1])in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::operator->
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb498);
    local_3b24._4_8_ =
         std::
         vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_ffffffffffffb498);
    local_3b24.nFee._0_4_ = 3;
    in_stack_ffffffffffffb4a8.__d.__r = (duration)0x1c9d877;
    in_stack_ffffffffffffb4a0 = &local_3b24;
    in_stack_ffffffffffffb498 = "pblocktemplate->block.vtx.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_3b24.m_sequence + 4),
               (undefined1 *)((long)&local_3b24.time.__d.__r + 4),0x204,1,2,
               (undefined1 *)((long)&local_3b24.nFee + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  for (i_6 = 0; i_6 < 0xb; i_6 = i_6 + 1) {
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffb498);
    ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
    CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
    local_3b30 = CBlockIndex::GetAncestor
                           ((CBlockIndex *)in_stack_ffffffffffffb4a8.__d.__r,
                            (int)((ulong)in_stack_ffffffffffffb4a0 >> 0x20));
    ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                         ((CBlockIndex **)
                          CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
                          (char *)in_stack_ffffffffffffb4d0,
                          (int)((ulong)in_stack_ffffffffffffb4c8 >> 0x20),
                          (char *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                          (char *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    (*ppCVar18)->nTime = (*ppCVar18)->nTime + 0x200;
  }
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  pCVar12 = CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  pCVar12->nHeight = pCVar12->nHeight + 1;
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffb498);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffb498);
  CChain::Tip((CChain *)in_stack_ffffffffffffb4a8.__d.__r);
  CBlockIndex::GetMedianTimePast
            ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
  SetMockTime((int64_t)in_stack_ffffffffffffb498);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),
               (const_string *)in_stack_ffffffffffffb4d0,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    AssemblerForTest((MinerTestingSetup *)
                     CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0),
                     (CTxMemPool *)CONCAT44(in_stack_ffffffffffffb4bc,in_stack_ffffffffffffb4b8));
    ::node::BlockAssembler::CreateNewBlock
              ((BlockAssembler *)CONCAT17(uVar7,in_stack_ffffffffffffb6b0),(CScript *)scriptPubKeyIn
              );
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::operator=
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
              ((assertion_result *)in_stack_ffffffffffffb4a8.__d.__r,
               (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb498 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3b68,local_3b90,local_3bb0,0x20d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb498);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb498);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb4a8.__d.__r);
    ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_ffffffffffffb498);
    in_stack_ffffffffffffb4df = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffb4df);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb498);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffb4df,in_stack_ffffffffffffb4d8),file
               ,(size_t)in_stack_ffffffffffffb4c8,
               (const_string *)CONCAT44(in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4c0));
    in_stack_ffffffffffffb4c8 = (CTransaction *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffb4a0,(char (*) [1])in_stack_ffffffffffffb498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb4a8.__d.__r,
               (pointer)in_stack_ffffffffffffb4a0,(unsigned_long)in_stack_ffffffffffffb498);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::operator->
              ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
               in_stack_ffffffffffffb498);
    local_3c0c._4_8_ =
         std::
         vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_ffffffffffffb498);
    local_3c0c.nFee._0_4_ = 5;
    in_stack_ffffffffffffb4a8.__d.__r = (duration)0x1bf4330;
    in_stack_ffffffffffffb4a0 = &local_3c0c;
    in_stack_ffffffffffffb498 = "pblocktemplate->block.vtx.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_3c0c.m_sequence + 4),
               (undefined1 *)((long)&local_3c0c.time.__d.__r + 4),0x20e,1,2,
               (undefined1 *)((long)&local_3c0c.nFee + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb498);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffb4c4 = CONCAT13(bVar6,(int3)in_stack_ffffffffffffb4c4);
  } while (bVar6);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             in_stack_ffffffffffffb4a8.__d.__r);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb4a8.__d.__r);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb498);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffb498);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MinerTestingSetup::TestBasicMining(const CScript& scriptPubKey, const std::vector<CTransactionRef>& txFirst, int baseheight)
{
    Txid hash;
    CMutableTransaction tx;
    TestMemPoolEntryHelper entry;
    entry.nFee = 11;
    entry.nHeight = 11;

    const CAmount BLOCKSUBSIDY = 50 * COIN;
    const CAmount LOWFEE = CENT;
    const CAmount HIGHFEE = COIN;
    const CAmount HIGHERFEE = 4 * COIN;

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // Just to make sure we can still make simple blocks
        auto pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey);
        BOOST_CHECK(pblocktemplate);

        // block sigops > limit: 1000 CHECKMULTISIG + 1
        tx.vin.resize(1);
        // NOTE: OP_NOP is used to force 20 SigOps for the CHECKMULTISIG
        tx.vin[0].scriptSig = CScript() << OP_0 << OP_0 << OP_0 << OP_NOP << OP_CHECKMULTISIG << OP_1;
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vout.resize(1);
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 1001; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            // If we don't set the # of sig ops in the CTxMemPoolEntry, template creation fails
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }

        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-blk-sigops"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 1001; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            // If we do set the # of sig ops in the CTxMemPoolEntry, template creation passes
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).SigOpsCost(80).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // block size > limit
        tx.vin[0].scriptSig = CScript();
        // 18 * (520char + DROP) + OP_1 = 9433 bytes
        std::vector<unsigned char> vchData(520);
        for (unsigned int i = 0; i < 18; ++i) {
            tx.vin[0].scriptSig << vchData << OP_DROP;
        }
        tx.vin[0].scriptSig << OP_1;
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 128; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // orphan in tx_mempool, template creation fails
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).FromTx(tx));
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-txns-inputs-missingorspent"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // child with higher feerate than parent
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vin[0].prevout.hash = txFirst[1]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY - HIGHFEE;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vin[0].prevout.hash = hash;
        tx.vin.resize(2);
        tx.vin[1].scriptSig = CScript() << OP_1;
        tx.vin[1].prevout.hash = txFirst[0]->GetHash();
        tx.vin[1].prevout.n = 0;
        tx.vout[0].nValue = tx.vout[0].nValue + BLOCKSUBSIDY - HIGHERFEE; // First txn output + fresh coinbase - new txn fee
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHERFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // coinbase in tx_mempool, template creation fails
        tx.vin.resize(1);
        tx.vin[0].prevout.SetNull();
        tx.vin[0].scriptSig = CScript() << OP_0 << OP_1;
        tx.vout[0].nValue = 0;
        hash = tx.GetHash();
        // give it a fee so it'll get mined
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(false).FromTx(tx));
        // Should throw bad-cb-multiple
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-cb-multiple"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // double spend txn pair in tx_mempool, template creation fails
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vout[0].nValue = BLOCKSUBSIDY - HIGHFEE;
        tx.vout[0].scriptPubKey = CScript() << OP_1;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vout[0].scriptPubKey = CScript() << OP_2;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-txns-inputs-missingorspent"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // subsidy changing
        int nHeight = m_node.chainman->ActiveChain().Height();
        // Create an actual 209999-long block chain (without valid blocks).
        while (m_node.chainman->ActiveChain().Tip()->nHeight < 209999) {
            CBlockIndex* prev = m_node.chainman->ActiveChain().Tip();
            CBlockIndex* next = new CBlockIndex();
            next->phashBlock = new uint256(m_rng.rand256());
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(next->GetBlockHash());
            next->pprev = prev;
            next->nHeight = prev->nHeight + 1;
            next->BuildSkip();
            m_node.chainman->ActiveChain().SetTip(*next);
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
        // Extend to a 210000-long block chain.
        while (m_node.chainman->ActiveChain().Tip()->nHeight < 210000) {
            CBlockIndex* prev = m_node.chainman->ActiveChain().Tip();
            CBlockIndex* next = new CBlockIndex();
            next->phashBlock = new uint256(m_rng.rand256());
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(next->GetBlockHash());
            next->pprev = prev;
            next->nHeight = prev->nHeight + 1;
            next->BuildSkip();
            m_node.chainman->ActiveChain().SetTip(*next);
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));

        // invalid p2sh txn in tx_mempool, template creation fails
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vout[0].nValue = BLOCKSUBSIDY - LOWFEE;
        CScript script = CScript() << OP_0;
        tx.vout[0].scriptPubKey = GetScriptForDestination(ScriptHash(script));
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vin[0].prevout.hash = hash;
        tx.vin[0].scriptSig = CScript() << std::vector<unsigned char>(script.begin(), script.end());
        tx.vout[0].nValue -= LOWFEE;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(false).FromTx(tx));
        // Should throw block-validation-failed
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("block-validation-failed"));

        // Delete the dummy blocks again.
        while (m_node.chainman->ActiveChain().Tip()->nHeight > nHeight) {
            CBlockIndex* del = m_node.chainman->ActiveChain().Tip();
            m_node.chainman->ActiveChain().SetTip(*Assert(del->pprev));
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(del->pprev->GetBlockHash());
            delete del->phashBlock;
            delete del;
        }
    }

    CTxMemPool& tx_mempool{MakeMempool()};
    LOCK(tx_mempool.cs);

    // non-final txs in mempool
    SetMockTime(m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1);
    const int flags{LOCKTIME_VERIFY_SEQUENCE};
    // height map
    std::vector<int> prevheights;

    // relative height locked
    tx.version = 2;
    tx.vin.resize(1);
    prevheights.resize(1);
    tx.vin[0].prevout.hash = txFirst[0]->GetHash(); // only 1 transaction
    tx.vin[0].prevout.n = 0;
    tx.vin[0].scriptSig = CScript() << OP_1;
    tx.vin[0].nSequence = m_node.chainman->ActiveChain().Tip()->nHeight + 1; // txFirst[0] is the 2nd block
    prevheights[0] = baseheight + 1;
    tx.vout.resize(1);
    tx.vout[0].nValue = BLOCKSUBSIDY-HIGHFEE;
    tx.vout[0].scriptPubKey = CScript() << OP_1;
    tx.nLockTime = 0;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    {
        CBlockIndex* active_chain_tip = m_node.chainman->ActiveChain().Tip();
        BOOST_CHECK(SequenceLocks(CTransaction(tx), flags, prevheights, *CreateBlockIndex(active_chain_tip->nHeight + 2, active_chain_tip))); // Sequence locks pass on 2nd block
    }

    // relative time locked
    tx.vin[0].prevout.hash = txFirst[1]->GetHash();
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG | (((m_node.chainman->ActiveChain().Tip()->GetMedianTimePast()+1-m_node.chainman->ActiveChain()[1]->GetMedianTimePast()) >> CTxIn::SEQUENCE_LOCKTIME_GRANULARITY) + 1); // txFirst[1] is the 3rd block
    prevheights[0] = baseheight + 2;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    const int SEQUENCE_LOCK_TIME = 512; // Sequence locks pass 512 seconds later
    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i)
        m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)->nTime += SEQUENCE_LOCK_TIME; // Trick the MedianTimePast
    {
        CBlockIndex* active_chain_tip = m_node.chainman->ActiveChain().Tip();
        BOOST_CHECK(SequenceLocks(CTransaction(tx), flags, prevheights, *CreateBlockIndex(active_chain_tip->nHeight + 1, active_chain_tip)));
    }

    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i) {
        CBlockIndex* ancestor{Assert(m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i))};
        ancestor->nTime -= SEQUENCE_LOCK_TIME; // undo tricked MTP
    }

    // absolute height locked
    tx.vin[0].prevout.hash = txFirst[2]->GetHash();
    tx.vin[0].nSequence = CTxIn::MAX_SEQUENCE_NONFINAL;
    prevheights[0] = baseheight + 3;
    tx.nLockTime = m_node.chainman->ActiveChain().Tip()->nHeight + 1;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(!CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime fails
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    BOOST_CHECK(IsFinalTx(CTransaction(tx), m_node.chainman->ActiveChain().Tip()->nHeight + 2, m_node.chainman->ActiveChain().Tip()->GetMedianTimePast())); // Locktime passes on 2nd block

    // absolute time locked
    tx.vin[0].prevout.hash = txFirst[3]->GetHash();
    tx.nLockTime = m_node.chainman->ActiveChain().Tip()->GetMedianTimePast();
    prevheights.resize(1);
    prevheights[0] = baseheight + 4;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(!CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime fails
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    BOOST_CHECK(IsFinalTx(CTransaction(tx), m_node.chainman->ActiveChain().Tip()->nHeight + 2, m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1)); // Locktime passes 1 second later

    // mempool-dependent transactions (not added)
    tx.vin[0].prevout.hash = hash;
    prevheights[0] = m_node.chainman->ActiveChain().Tip()->nHeight + 1;
    tx.nLockTime = 0;
    tx.vin[0].nSequence = 0;
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    tx.vin[0].nSequence = 1;
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG;
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG | 1;
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    auto pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey);
    BOOST_CHECK(pblocktemplate);

    // None of the of the absolute height/time locked tx should have made
    // it into the template because we still check IsFinalTx in CreateNewBlock,
    // but relative locked txs will if inconsistently added to mempool.
    // For now these will still generate a valid template until BIP68 soft fork
    BOOST_CHECK_EQUAL(pblocktemplate->block.vtx.size(), 3U);
    // However if we advance height by 1 and time by SEQUENCE_LOCK_TIME, all of them should be mined
    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i) {
        CBlockIndex* ancestor{Assert(m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i))};
        ancestor->nTime += SEQUENCE_LOCK_TIME; // Trick the MedianTimePast
    }
    m_node.chainman->ActiveChain().Tip()->nHeight++;
    SetMockTime(m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1);

    BOOST_CHECK(pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    BOOST_CHECK_EQUAL(pblocktemplate->block.vtx.size(), 5U);
}